

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t decode_code_length(archive_read *a,rar5 *rar,uint8_t *p,uint16_t code)

{
  undefined8 in_RAX;
  uint uVar1;
  wchar_t wVar2;
  wchar_t n;
  undefined6 in_register_0000000a;
  wchar_t add;
  wchar_t local_14;
  
  local_14 = (wchar_t)((ulong)in_RAX >> 0x20);
  uVar1 = (uint)CONCAT62(in_register_0000000a,code);
  if (code < 8) {
    wVar2 = uVar1 + L'\x02';
  }
  else {
    n = (uVar1 >> 2) + L'\xffffffff';
    wVar2 = read_consume_bits(a,rar,p,n,&local_14);
    wVar2 = -(uint)(wVar2 != L'\0') | ((uVar1 & 3 | 4) << ((byte)n & 0x1f)) + local_14 + 2U;
  }
  return wVar2;
}

Assistant:

static int decode_code_length(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint16_t code)
{
	int lbits, length = 2;

	if(code < 8) {
		lbits = 0;
		length += code;
	} else {
		lbits = code / 4 - 1;
		length += (4 | (code & 3)) << lbits;
	}

	if(lbits > 0) {
		int add;

		if(ARCHIVE_OK != read_consume_bits(a, rar, p, lbits, &add))
			return -1;

		length += add;
	}

	return length;
}